

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O1

void __thiscall random_tests::shuffle_stat_test::test_method(shuffle_stat_test *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  iterator in_R8;
  iterator in_R9;
  iterator pvVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar12;
  double local_3368;
  undefined4 local_334c;
  undefined1 local_3348 [16];
  undefined1 *local_3338;
  char *local_3330;
  undefined1 *local_3328;
  undefined1 *local_3320;
  char *local_3318;
  char *local_3310;
  char *local_3308;
  char *local_3300;
  undefined1 *local_32f8;
  undefined1 *local_32f0;
  char *local_32e8;
  char *local_32e0;
  char *local_32d8;
  char *local_32d0;
  undefined1 *local_32c8;
  undefined1 *local_32c0;
  char *local_32b8;
  char *local_32b0;
  char *local_32a8;
  char *local_32a0;
  undefined1 *local_3298;
  undefined1 *local_3290;
  char *local_3288;
  char *local_3280;
  char *local_3278;
  char *local_3270;
  undefined1 *local_3268;
  undefined1 *local_3260;
  char *local_3258;
  char *local_3250;
  char *local_3248;
  char *local_3240;
  undefined1 *local_3238;
  undefined1 *local_3230;
  char *local_3228;
  char *local_3220;
  uint sum;
  undefined4 *local_3210;
  undefined **local_3208;
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_3200;
  undefined4 **local_31f0;
  uint *local_31e8;
  char *local_31e0;
  char *local_31d8;
  assertion_result local_31d0;
  uint32_t counts [3125];
  FastRandomContext ctx;
  int data [5];
  int iStack_44;
  uint **local_40;
  long local_38;
  
  counts[0x862] = 0;
  counts[0x863] = 0;
  counts[0x462] = 0;
  counts[0x463] = 0;
  counts[0x62] = 0;
  counts[99] = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&ctx,true);
  memset(counts,0,0x30d4);
  iVar7 = 12000;
  msg.m_begin = in_R8;
  do {
    data[0] = 0;
    data[1] = 1;
    data[2]._0_1_ = 2;
    data._9_7_ = 0x3000000;
    data[4] = 4;
    std::shuffle<int*,FastRandomContext&>(data,&iStack_44,&ctx);
    auVar3[4] = (undefined1)data[2];
    auVar3._0_4_ = data[1];
    auVar3._5_7_ = data._9_7_;
    auVar2._12_4_ = data[4];
    auVar2._0_12_ = auVar3;
    counts[data[4] * 0x271 + auVar3._4_4_ * 0x19 +
           (int)((auVar2._8_8_ & 0xffffffff) * 0x7d) + data[1] * 5 + data[0]] =
         counts[data[4] * 0x271 + auVar3._4_4_ * 0x19 +
                (int)((auVar2._8_8_ & 0xffffffff) * 0x7d) + data[1] * 5 + data[0]] + 1;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  sum = 0;
  local_3368 = 0.0;
  uVar11 = 0;
  do {
    uVar5 = uVar11 & 0xffffffff;
    iVar7 = (int)(uVar5 / 0x7d) + (int)(uVar5 / 0x271) * -5;
    uVar1 = counts[uVar11];
    iVar8 = (int)(uVar5 / 0x271);
    if (((iVar7 == iVar8) ||
        (iVar6 = (int)(uVar5 / 0x19) + (int)(uVar5 / 0x7d) * -5, iVar6 == iVar8)) ||
       (iVar6 == iVar7)) {
LAB_00540534:
      local_3228 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3220 = "";
      local_3238 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3230 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0xe5;
      file_01.m_begin = (iterator)&local_3228;
      msg_01.m_end = in_R9;
      msg_01.m_begin = msg.m_begin;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3238,
                 msg_01);
      local_3208 = (undefined **)CONCAT71(local_3208._1_7_,uVar1 == 0);
      local_3200.px = (element_type *)0x0;
      local_3200.pn.pi_ = (sp_counted_base *)0x0;
      local_3348._0_8_ = "count == 0";
      local_3348._8_8_ = "";
      data[2]._0_1_ = 0;
      data[0] = 0x13abc70;
      data[1] = 0;
      data[4] = 0x13c0138;
      iStack_44 = 0;
      local_40 = (uint **)local_3348;
      local_3248 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3240 = "";
      msg.m_begin = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_3208,(lazy_ostream *)data,1,0,WARN,_cVar12,
                 (size_t)&local_3248,0xe5);
      boost::detail::shared_count::~shared_count(&local_3200.pn);
    }
    else {
      iVar8 = (int)(uVar5 / 0x19);
      msg.m_begin = (iterator)(ulong)(uint)(iVar8 * 5);
      iVar9 = (int)(uVar5 / 5) + iVar8 * -5;
      iVar8 = (int)(uVar5 / 0x271);
      if (((iVar9 == iVar8) || (iVar9 == iVar7)) || (iVar9 == iVar6)) goto LAB_00540534;
      iVar4 = (int)(uVar5 / 5);
      msg.m_begin = (iterator)(ulong)(uint)(iVar4 * 5);
      iVar4 = (int)uVar11 + iVar4 * -5;
      if (((iVar4 == iVar8) || (iVar4 == iVar7)) || ((iVar4 == iVar9 || (iVar4 == iVar6))))
      goto LAB_00540534;
      local_3258 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3250 = "";
      local_3268 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3260 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0xe8;
      file.m_begin = (iterator)&local_3258;
      msg.m_end = in_R9;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3268,msg
                );
      local_3200 = (shared_ptr<boost::basic_wrap_stringstream<char>_>)ZEXT816(0);
      local_3348._0_8_ = "count > 50";
      local_3348._8_8_ = "";
      data[2]._0_1_ = 0;
      data[0] = 0x13abc70;
      data[1] = 0;
      data[4] = 0x13c0138;
      iStack_44 = 0;
      local_40 = (uint **)local_3348;
      local_3278 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3270 = "";
      msg.m_begin = (iterator)0x1;
      pvVar10 = (iterator)0x0;
      local_3208._0_1_ = (class_property<bool>)(class_property<bool>)(0x32 < uVar1);
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_3208,(lazy_ostream *)data,1,0,WARN,_cVar12,
                 (size_t)&local_3278,0xe8);
      boost::detail::shared_count::~shared_count(&local_3200.pn);
      local_3288 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3280 = "";
      local_3298 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3290 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xe9;
      file_00.m_begin = (iterator)&local_3288;
      msg_00.m_end = pvVar10;
      msg_00.m_begin = msg.m_begin;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3298,
                 msg_00);
      local_3208 = (undefined **)CONCAT71(local_3208._1_7_,uVar1 < 0x96);
      local_3200 = (shared_ptr<boost::basic_wrap_stringstream<char>_>)ZEXT816(0);
      local_3348._0_8_ = "count < 150";
      local_3348._8_8_ = "";
      data[2]._0_1_ = 0;
      data[0] = 0x13abc70;
      data[1] = 0;
      data[4] = 0x13c0138;
      iStack_44 = 0;
      local_40 = (uint **)local_3348;
      local_32a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_32a0 = "";
      msg.m_begin = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_3208,(lazy_ostream *)data,1,0,WARN,_cVar12,
                 (size_t)&local_32a8,0xe9);
      local_3368 = local_3368 + (((double)uVar1 + -100.0) * ((double)uVar1 + -100.0)) / 100.0;
      boost::detail::shared_count::~shared_count(&local_3200.pn);
      sum = sum + uVar1;
    }
    uVar11 = uVar11 + 1;
    if (uVar11 == 0xc35) {
      local_32b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_32b0 = "";
      local_32c8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_32c0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0xed;
      file_02.m_begin = (iterator)&local_32b8;
      msg_02.m_end = in_R9;
      msg_02.m_begin = msg.m_begin;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_32c8,
                 msg_02);
      local_3200 = (shared_ptr<boost::basic_wrap_stringstream<char>_>)ZEXT816(0);
      local_3348._0_8_ = "chi_score > 58.1411";
      local_3348._8_8_ = "";
      data[2]._0_1_ = 0;
      data[0] = 0x13abc70;
      data[1] = 0;
      data[4] = 0x13c0138;
      iStack_44 = 0;
      local_40 = (uint **)local_3348;
      local_32d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_32d0 = "";
      msg.m_begin = (iterator)0x1;
      pvVar10 = (iterator)0x0;
      local_3208._0_1_ = (class_property<bool>)(class_property<bool>)(58.1411 < local_3368);
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_3208,(lazy_ostream *)data,1,0,WARN,_cVar12,
                 (size_t)&local_32d8,0xed);
      boost::detail::shared_count::~shared_count(&local_3200.pn);
      local_32e8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_32e0 = "";
      local_32f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_32f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0xee;
      file_03.m_begin = (iterator)&local_32e8;
      msg_03.m_end = pvVar10;
      msg_03.m_begin = msg.m_begin;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_32f8,
                 msg_03);
      local_3208 = (undefined **)CONCAT71(local_3208._1_7_,local_3368 < 210.275);
      local_3200 = (shared_ptr<boost::basic_wrap_stringstream<char>_>)ZEXT816(0);
      local_3348._0_8_ = "chi_score < 210.275";
      local_3348._8_8_ = "";
      data[2]._0_1_ = 0;
      data[0] = 0x13abc70;
      data[1] = 0;
      data[4] = 0x13c0138;
      iStack_44 = 0;
      local_40 = (uint **)local_3348;
      local_3308 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3300 = "";
      msg.m_begin = (iterator)0x1;
      pvVar10 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_3208,(lazy_ostream *)data,1,0,WARN,_cVar12,
                 (size_t)&local_3308,0xee);
      boost::detail::shared_count::~shared_count(&local_3200.pn);
      local_3318 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3310 = "";
      local_3328 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3320 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0xef;
      file_04.m_begin = (iterator)&local_3318;
      msg_04.m_end = pvVar10;
      msg_04.m_begin = msg.m_begin;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3328,
                 msg_04);
      local_3348._8_8_ = local_3348._8_8_ & 0xffffffffffffff00;
      local_3348._0_8_ = &PTR__lazy_ostream_013abb30;
      local_3338 = boost::unit_test::lazy_ostream::inst;
      local_3330 = "";
      local_31e8 = &sum;
      local_31d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(sum == 12000);
      local_3210 = &local_334c;
      local_334c = 12000;
      local_31d0.m_message.px = (element_type *)0x0;
      local_31d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_31e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_31d8 = "";
      local_40 = &local_31e8;
      data[2]._0_1_ = 0;
      data[0] = 0x13abbb0;
      data[1] = 0;
      data[4] = 0x13c0138;
      iStack_44 = 0;
      local_31f0 = &local_3210;
      local_3200.px = (element_type *)(local_3200._1_8_ << 8);
      local_3208 = &PTR__lazy_ostream_013abbb0;
      local_3200.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      boost::test_tools::tt_detail::report_assertion
                (&local_31d0,(lazy_ostream *)local_3348,1,2,REQUIRE,0xe95717,(size_t)&local_31e0,
                 0xef,(lazy_ostream *)data,"12000U",(assertion_result *)&local_3208);
      boost::detail::shared_count::~shared_count(&local_31d0.m_message.pn);
      ChaCha20::~ChaCha20(&ctx.rng);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(shuffle_stat_test)
{
    FastRandomContext ctx(true);
    uint32_t counts[5 * 5 * 5 * 5 * 5] = {0};
    for (int i = 0; i < 12000; ++i) {
        int data[5] = {0, 1, 2, 3, 4};
        std::shuffle(std::begin(data), std::end(data), ctx);
        int pos = data[0] + data[1] * 5 + data[2] * 25 + data[3] * 125 + data[4] * 625;
        ++counts[pos];
    }
    unsigned int sum = 0;
    double chi_score = 0.0;
    for (int i = 0; i < 5 * 5 * 5 * 5 * 5; ++i) {
        int i1 = i % 5, i2 = (i / 5) % 5, i3 = (i / 25) % 5, i4 = (i / 125) % 5, i5 = i / 625;
        uint32_t count = counts[i];
        if (i1 == i2 || i1 == i3 || i1 == i4 || i1 == i5 || i2 == i3 || i2 == i4 || i2 == i5 || i3 == i4 || i3 == i5 || i4 == i5) {
            BOOST_CHECK(count == 0);
        } else {
            chi_score += ((count - 100.0) * (count - 100.0)) / 100.0;
            BOOST_CHECK(count > 50);
            BOOST_CHECK(count < 150);
            sum += count;
        }
    }
    BOOST_CHECK(chi_score > 58.1411); // 99.9999% confidence interval
    BOOST_CHECK(chi_score < 210.275);
    BOOST_CHECK_EQUAL(sum, 12000U);
}